

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall
embree::CommandLineParser::parseCommandLine
          (CommandLineParser *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  iterator iVar7;
  string tag0;
  string tag;
  ParseStream *local_c0;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  long local_88;
  char local_80 [16];
  FileName *local_70;
  _Base_ptr local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *local_60;
  CommandLineParser *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_b0.field_2;
  local_60 = &this->commandLineOptionMap;
  local_68 = &(this->commandLineOptionMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_70 = path;
  local_58 = this;
  do {
    Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (&local_50,
               &cin->ptr->
                super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    local_b4 = std::__cxx11::string::compare((char *)&local_50);
    if (local_b4 != 0) {
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      lVar4 = std::__cxx11::string::find((char *)&local_50,0x25253f,0);
      if (lVar4 == 0) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_50);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        lVar4 = std::__cxx11::string::find((char *)&local_50,0x25253f,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_50);
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
                ::find(&local_60->_M_t,&local_50);
        if (iVar7._M_node == local_68) goto LAB_00136fec;
        plVar2 = *(long **)(iVar7._M_node + 2);
        local_c0 = cin->ptr;
        if (local_c0 != (ParseStream *)0x0) {
          (*(local_c0->
            super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_RefCount._vptr_RefCount[2])();
        }
        (**(code **)(*plVar2 + 0x20))(plVar2,&local_c0,local_70);
        if (local_c0 != (ParseStream *)0x0) {
          (*(local_c0->
            super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_RefCount._vptr_RefCount[3])();
        }
      }
      else {
LAB_00136fec:
        if (local_58->verbosity != SILENT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown command line parameter: ",0x20);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_90,local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          while( true ) {
            pbVar6 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::peek(&cin->ptr->
                             super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           );
            iVar3 = std::__cxx11::string::compare((char *)pbVar6);
            if ((iVar3 == 0) ||
               (pbVar6 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::peek(&cin->ptr->
                                 super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ), *(pbVar6->_M_dataplus)._M_p == '-')) break;
            Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get(&local_b0,
                  &cin->ptr->
                   super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,
                                local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
        }
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_b4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void CommandLineParser::parseCommandLine(Ref<ParseStream> cin, const FileName& path)
  {
    while (true)
    {
      std::string tag = cin->getString();
      if (tag == "") return;
      std::string tag0 = tag;
      
      /* remove - or -- and lookup command line option */
      if (tag.find("-") == 0) 
      {
        tag = tag.substr(1);
        if (tag.find("-") == 0) tag = tag.substr(1);
        auto option = commandLineOptionMap.find(tag);
      
        /* process command line option */
        if (option != commandLineOptionMap.end()) {
          option->second->parse(cin,path);
          continue;
        }
      }
      
      if (verbosity != SILENT) {
        /* handle unknown command line options */
        std::cerr << "unknown command line parameter: " << tag0 << " ";
        while (cin->peek() != "" && cin->peek()[0] != '-') std::cerr << cin->getString() << " ";
        std::cerr << std::endl;
      }
    }
  }